

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad>::CalcStiffT<std::complex<double>>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad> *this,
          TPZElementMatrixT<std::complex<double>_> *ek,TPZElementMatrixT<std::complex<double>_> *ef)

{
  long lVar1;
  TPZElementMatrixT<std::complex<double>_> *pTVar2;
  int64_t iVar3;
  _func_int **pp_Var4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long *plVar10;
  TPZIntPoints *rval;
  uint uVar11;
  long lVar12;
  long lVar13;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad> *this_00;
  TPZCompElSide *pTVar14;
  int *piVar15;
  TPZAutoPointer<TPZIntPoints> intrule;
  int order;
  REAL weight;
  REAL detJac;
  TPZManVector<int,_4> intorder;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZFMatrix<double> jac;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> datavec;
  TPZAutoPointer<TPZIntPoints> TStack_40530;
  int iStack_40524;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad> *pTStack_40520;
  double dStack_40518;
  TPZElementMatrixT<std::complex<double>_> *pTStack_40510;
  TPZElementMatrixT<std::complex<double>_> *pTStack_40508;
  TPZGeoEl *pTStack_40500;
  long *plStack_404f8;
  TPZManVector<int,_4> TStack_404f0;
  _func_int **pp_Stack_404c0;
  double dStack_404b8;
  TPZVec<double> TStack_404b0;
  double adStack_40490 [4];
  TPZManVector<int,_4> TStack_40470;
  TPZFMatrix<double> TStack_40440;
  TPZFMatrix<double> TStack_403b0;
  TPZFMatrix<double> TStack_40320;
  TPZManVector<TPZTransform<double>,_10> TStack_40290;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> TStack_3f230;
  
  lVar9 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))();
  if (lVar9 != 0) {
    plStack_404f8 =
         (long *)__dynamic_cast(lVar9,&TPZMaterial::typeinfo,
                                &TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                                0xfffffffffffffffe);
    if (plStack_404f8 != (long *)0x0) {
      lVar9 = __dynamic_cast(lVar9,&TPZMaterial::typeinfo,
                             &TPZNullMaterialCS<std::complex<double>>::typeinfo,0);
      if (lVar9 == 0) {
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xf8))
                  (this,ek,ef);
        iVar5 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                          (this);
        if (iVar5 != 0) {
          TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6>::TPZManVector(&TStack_3f230,0);
          lVar9 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
          (*TStack_3f230.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>._vptr_TPZVec[3])
                    (&TStack_3f230,lVar9);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x290))
                    (this,&TStack_3f230,0);
          TPZManVector<TPZTransform<double>,_10>::TPZManVector(&TStack_40290,0);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                    (this);
          iVar5 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0
                              ))(this);
          TStack_40530.fRef = (TPZReference *)operator_new(0x10);
          ((TStack_40530.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
          (TStack_40530.fRef)->fPointer = (TPZIntPoints *)0x0;
          LOCK();
          ((TStack_40530.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
          UNLOCK();
          TPZVec<double>::TPZVec(&TStack_404b0,0);
          TStack_404b0.fStore = adStack_40490;
          TStack_404b0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b960;
          TStack_404b0.fNElements = 2;
          TStack_404b0.fNAlloc = 0;
          adStack_40490[0] = 0.0;
          adStack_40490[1] = 0.0;
          dStack_40518 = 0.0;
          pTStack_40520 = this;
          pTStack_40510 = ef;
          pTStack_40508 = ek;
          TPZVec<int>::TPZVec(&TStack_404f0.super_TPZVec<int>,0);
          TStack_404f0.super_TPZVec<int>.fStore = TStack_404f0.fExtAlloc;
          TStack_404f0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdaf8;
          TStack_404f0.super_TPZVec<int>.fNElements = 0;
          TStack_404f0.super_TPZVec<int>.fNAlloc = 0;
          if (0 < lVar9) {
            lVar13 = 17000;
            lVar12 = 0;
            do {
              lVar1 = *(long *)((long)&((pTStack_40520->fElementVec).super_TPZVec<TPZCompElSide>.
                                       fStore)->fEl + lVar12);
              if (lVar1 != 0) {
                plVar10 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                                 &TPZInterpolationSpace::typeinfo,0);
                if (plVar10 != (long *)0x0) {
                  TPZManVector<int,_4>::Resize
                            (&TStack_404f0,TStack_404f0.super_TPZVec<int>.fNElements + 1);
                  iVar3 = TStack_404f0.super_TPZVec<int>.fNElements;
                  uVar6 = (**(code **)(*plVar10 + 0x268))(plVar10);
                  *(undefined4 *)
                   ((long)((TStack_3f230.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>.
                           fStore)->super_TPZMaterialData).super_TPZShapeData.fCornerNodeIds.
                          fExtAlloc + lVar13 + -0x30) = uVar6;
                  *(undefined4 *)
                   ((long)TStack_404f0.super_TPZVec<int>.fStore +
                   ((iVar3 << 0x20) + -0x100000000 >> 0x1e)) = uVar6;
                }
              }
              lVar12 = lVar12 + 0x10;
              lVar13 = lVar13 + 0xa850;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          iStack_40524 = (**(code **)(*plStack_404f8 + 0x48))(plStack_404f8,&TStack_404f0);
          this_00 = pTStack_40520;
          pTStack_40500 = TPZCompEl::Reference((TPZCompEl *)pTStack_40520);
          pTVar2 = pTStack_40508;
          iVar7 = (**(code **)(*(long *)pTStack_40500 + 0xf0))();
          rval = (TPZIntPoints *)
                 (**(code **)(*(long *)pTStack_40500 + 0x70))(pTStack_40500,iVar7 + -1,iStack_40524)
          ;
          TPZAutoPointer<TPZIntPoints>::operator=(&TStack_40530,rval);
          TPZManVector<int,_4>::TPZManVector(&TStack_40470,(long)iVar5,&iStack_40524);
          (*(TStack_40530.fRef)->fPointer->_vptr_TPZIntPoints[5])
                    ((TStack_40530.fRef)->fPointer,&TStack_40470,0);
          uVar8 = (*(TStack_40530.fRef)->fPointer->_vptr_TPZIntPoints[3])();
          if (1000 < (int)uVar8) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                       ,0x36d);
          }
          TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
          TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
          TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          TStack_40320.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFMatrix_018151d8;
          TStack_40320.fElem = (double *)0x0;
          TStack_40320.fGiven = (double *)0x0;
          TStack_40320.fSize = 0;
          TPZVec<int>::TPZVec(&TStack_40320.fPivot.super_TPZVec<int>,0);
          TStack_40320.fPivot.super_TPZVec<int>.fStore = TStack_40320.fPivot.fExtAlloc;
          TStack_40320.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          TStack_40320.fPivot.super_TPZVec<int>.fNElements = 0;
          TStack_40320.fPivot.super_TPZVec<int>.fNAlloc = 0;
          TStack_40320.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_40320.fWork.fStore = (double *)0x0;
          TStack_40320.fWork.fNElements = 0;
          TStack_40320.fWork.fNAlloc = 0;
          TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
          TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
          TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          TStack_403b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFMatrix_018151d8;
          TStack_403b0.fElem = (double *)0x0;
          TStack_403b0.fGiven = (double *)0x0;
          TStack_403b0.fSize = 0;
          TPZVec<int>::TPZVec(&TStack_403b0.fPivot.super_TPZVec<int>,0);
          TStack_403b0.fPivot.super_TPZVec<int>.fStore = TStack_403b0.fPivot.fExtAlloc;
          TStack_403b0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          TStack_403b0.fPivot.super_TPZVec<int>.fNElements = 0;
          TStack_403b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          TStack_403b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_403b0.fWork.fStore = (double *)0x0;
          TStack_403b0.fWork.fNElements = 0;
          TStack_403b0.fWork.fNAlloc = 0;
          TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
          TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
          TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          TStack_40440.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFMatrix_018151d8;
          TStack_40440.fElem = (double *)0x0;
          TStack_40440.fGiven = (double *)0x0;
          TStack_40440.fSize = 0;
          TPZVec<int>::TPZVec(&TStack_40440.fPivot.super_TPZVec<int>,0);
          TStack_40440.fPivot.super_TPZVec<int>.fStore = TStack_40440.fPivot.fExtAlloc;
          TStack_40440.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          TStack_40440.fPivot.super_TPZVec<int>.fNElements = 0;
          TStack_40440.fPivot.super_TPZVec<int>.fNAlloc = 0;
          pp_Stack_404c0 = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_40440.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_40440.fWork.fStore = (double *)0x0;
          TStack_40440.fWork.fNElements = 0;
          TStack_40440.fWork.fNAlloc = 0;
          if (0 < (int)uVar8) {
            pTStack_40508 = (TPZElementMatrixT<std::complex<double>_> *)&pTVar2->fMat;
            pTStack_40510 = (TPZElementMatrixT<std::complex<double>_> *)&pTStack_40510->fMat;
            uVar11 = 0;
            do {
              (*(TStack_40530.fRef)->fPointer->_vptr_TPZIntPoints[4])
                        ((TStack_40530.fRef)->fPointer,(ulong)uVar11,&TStack_404b0,&dStack_40518);
              TPZGeoEl::Jacobian(pTStack_40500,&TStack_404b0,&TStack_40320,&TStack_403b0,
                                 &dStack_404b8,&TStack_40440);
              dStack_40518 = ABS(dStack_404b8) * dStack_40518;
              lVar9 = (this_00->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
              if (0 < lVar9) {
                pTVar14 = (pTStack_40520->fElementVec).super_TPZVec<TPZCompElSide>.fStore;
                piVar15 = &((TStack_3f230.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>.
                            fStore)->super_TPZMaterialData).intLocPtIndex;
                do {
                  if (pTVar14->fEl != (TPZCompEl *)0x0) {
                    lVar12 = __dynamic_cast(pTVar14->fEl,&TPZCompEl::typeinfo,
                                            &TPZInterpolationSpace::typeinfo,0);
                    if (lVar12 != 0) {
                      *piVar15 = uVar11;
                    }
                  }
                  piVar15 = piVar15 + 0x2a14;
                  pTVar14 = pTVar14 + 1;
                  lVar9 = lVar9 + -1;
                } while (lVar9 != 0);
              }
              this_00 = pTStack_40520;
              (**(code **)(*(long *)&(pTStack_40520->super_TPZMultiphysicsElement).super_TPZCompEl +
                          0x2b0))(pTStack_40520,&TStack_404b0,&TStack_40290,&TStack_3f230);
              (**(code **)(*plStack_404f8 + 0x68))
                        (dStack_40518,plStack_404f8,&TStack_3f230,pTStack_40508,pTStack_40510);
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar8);
          }
          CleanupMaterialDataT<std::complex<double>>
                    (this_00,&TStack_3f230.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_40440);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_403b0);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_40320);
          if (TStack_40470.super_TPZVec<int>.fStore != TStack_40470.fExtAlloc) {
            TStack_40470.super_TPZVec<int>.fNAlloc = 0;
            TStack_40470.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
            if (TStack_40470.super_TPZVec<int>.fStore != (int *)0x0) {
              operator_delete__(TStack_40470.super_TPZVec<int>.fStore);
            }
          }
          pp_Var4 = pp_Stack_404c0;
          if (TStack_404f0.super_TPZVec<int>.fStore != TStack_404f0.fExtAlloc) {
            TStack_404f0.super_TPZVec<int>.fNAlloc = 0;
            TStack_404f0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
            if (TStack_404f0.super_TPZVec<int>.fStore != (int *)0x0) {
              operator_delete__(TStack_404f0.super_TPZVec<int>.fStore);
            }
          }
          if (TStack_404b0.fStore != adStack_40490) {
            TStack_404b0.fNAlloc = 0;
            TStack_404b0._vptr_TPZVec = pp_Var4;
            if (TStack_404b0.fStore != (double *)0x0) {
              operator_delete__(TStack_404b0.fStore);
            }
          }
          TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&TStack_40530);
          TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&TStack_40290);
          TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6>::~TPZManVector(&TStack_3f230);
        }
      }
      else {
        TPZElementMatrixT<std::complex<double>_>::Reset(ek,(TPZCompMesh *)0x0,Unknown);
        TPZElementMatrixT<std::complex<double>_>::Reset(ef,(TPZCompMesh *)0x0,Unknown);
        (ek->super_TPZElementMatrix).fType = EK;
        (ef->super_TPZElementMatrix).fType = EF;
      }
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad>::CalcStiffT(TPZElementMatrixT<TVar> &, TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoQuad, TVar = std::complex<double>]"
             ,0xae);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
  TPZElementMatrixT<std::complex<double>_>::Reset(ek,(TPZCompMesh *)0x0,Unknown);
  TPZElementMatrixT<std::complex<double>_>::Reset(ef,(TPZCompMesh *)0x0,Unknown);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcStiffT(TPZElementMatrixT<TVar> &ek, TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ek.Reset();
        ef.Reset();
        return;
    }
    
    auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(material);
    if(nullmat)
    {
        ek.Reset();
        ef.Reset();
        ek.fType = TPZElementMatrix::EK;
        ef.fType = TPZElementMatrix::EF;
        return;
    }
    InitializeElementMatrix(ek,ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,6> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,4> intpointtemp(TGeometry::Dimension,0.);
    REAL weight = 0.;
    
    TPZManVector<int,4> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,4> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int i = 0; i < fElementVec.size(); i++) {
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[i].Element());
            if (!msp) {
                continue;
            }
            datavec[i].intLocPtIndex = int_ind;
        }
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ek.fMat,ef.fMat);
    }//loop over integration points
    
    CleanupMaterialData(datavec);
}